

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidator.cpp
# Opt level: O1

Result * CoreML::validate<(MLModelType)403>(Result *__return_storage_ptr__,Model *format)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *psVar2;
  pointer pcVar3;
  Rep *pRVar4;
  long lVar5;
  bool bVar6;
  int iVar7;
  NeuralNetworkClassifier *pNVar8;
  iterator iVar9;
  long *plVar10;
  size_type *psVar11;
  void **ppvVar12;
  undefined1 in_R9B;
  long lVar13;
  long lVar14;
  ModelDescription *pMVar15;
  Result r;
  string err;
  string probBlob;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  outputBlobNames;
  pointer local_f8;
  _Alloc_hider local_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  string local_d0;
  undefined1 local_b0 [8];
  _Alloc_hider local_a8;
  undefined1 local_a0 [24];
  Result *local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  if (format->_oneof_case_[0] == 0x193) {
    pNVar8 = (NeuralNetworkClassifier *)(format->Type_).pipelineclassifier_;
  }
  else {
    pNVar8 = Specification::NeuralNetworkClassifier::default_instance();
  }
  validateClassifierInterface<CoreML::Specification::Model,CoreML::Specification::NeuralNetworkClassifier>
            ((Result *)&local_f8,(CoreML *)format,(Model *)pNVar8,(NeuralNetworkClassifier *)0x0,
             false,(bool)in_R9B);
  bVar6 = Result::good((Result *)&local_f8);
  if (bVar6) {
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    pMVar15 = format->description_;
    if (pMVar15 == (ModelDescription *)0x0) {
      pMVar15 = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
    }
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    if (format->_oneof_case_[0] == 0x193) {
      pNVar8 = (format->Type_).neuralnetworkclassifier_;
    }
    else {
      pNVar8 = Specification::NeuralNetworkClassifier::default_instance();
    }
    validateNeuralNetworkTopLevel<CoreML::Specification::NeuralNetworkClassifier>
              ((Result *)local_b0,pMVar15,pNVar8,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_60,format->isupdatable_);
    local_f8 = (pointer)local_b0;
    std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_a8);
    if (local_a8._M_p != local_a0 + 8) {
      operator_delete(local_a8._M_p,local_a0._8_8_ + 1);
    }
    bVar6 = Result::good((Result *)&local_f8);
    if (bVar6) {
      if (format->_oneof_case_[0] == 0x193) {
        pNVar8 = (NeuralNetworkClassifier *)(format->Type_).neuralnetworkregressor_;
      }
      else {
        pNVar8 = Specification::NeuralNetworkClassifier::default_instance();
      }
      psVar2 = (pNVar8->labelprobabilitylayername_).ptr_;
      local_b0 = (undefined1  [8])local_a0;
      pcVar3 = (psVar2->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_b0,pcVar3,pcVar3 + psVar2->_M_string_length);
      iVar7 = std::__cxx11::string::compare(local_b0);
      if ((iVar7 == 0) ||
         (iVar9 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find(&local_60,(key_type *)local_b0),
         (_Rb_tree_header *)iVar9._M_node != &local_60._M_impl.super__Rb_tree_header)) {
        pMVar15 = format->description_;
        if (pMVar15 == (ModelDescription *)0x0) {
          pMVar15 = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
        }
        pRVar4 = (pMVar15->output_).super_RepeatedPtrFieldBase.rep_;
        ppvVar12 = pRVar4->elements;
        if (pRVar4 == (Rep *)0x0) {
          ppvVar12 = (void **)0x0;
        }
        lVar13 = (long)(pMVar15->output_).super_RepeatedPtrFieldBase.current_size_;
        local_88 = __return_storage_ptr__;
        if (lVar13 != 0) {
          lVar14 = 0;
          do {
            lVar5 = *(long *)((long)ppvVar12 + lVar14);
            iVar9 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::find(&local_60,*(key_type **)(lVar5 + 0x10));
            if ((((_Rb_tree_header *)iVar9._M_node == &local_60._M_impl.super__Rb_tree_header) &&
                (iVar7 = std::__cxx11::string::compare(*(string **)(lVar5 + 0x10)), iVar7 != 0)) &&
               (iVar7 = std::__cxx11::string::compare(*(string **)(lVar5 + 0x10)), iVar7 != 0)) {
              std::operator+(&local_80,"Output layer \'",
                             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                              (lVar5 + 0x10));
              plVar10 = (long *)std::__cxx11::string::append((char *)&local_80);
              __return_storage_ptr__ = local_88;
              local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
              psVar11 = (size_type *)(plVar10 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar11) {
                local_d0.field_2._M_allocated_capacity = *psVar11;
                local_d0.field_2._8_8_ = plVar10[3];
              }
              else {
                local_d0.field_2._M_allocated_capacity = *psVar11;
                local_d0._M_dataplus._M_p = (pointer)*plVar10;
              }
              local_d0._M_string_length = plVar10[1];
              *plVar10 = (long)psVar11;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_80._M_dataplus._M_p != &local_80.field_2) {
                operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1
                               );
              }
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_d0);
              goto LAB_004f30a0;
            }
            lVar14 = lVar14 + 8;
          } while (lVar13 * 8 != lVar14);
        }
        *(pointer *)local_88 = local_f8;
        paVar1 = &(local_88->m_message).field_2;
        (local_88->m_message)._M_dataplus._M_p = (pointer)paVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_p == &local_e0) {
          paVar1->_M_allocated_capacity =
               CONCAT71(local_e0._M_allocated_capacity._1_7_,local_e0._M_local_buf[0]);
          *(undefined8 *)((long)&(local_88->m_message).field_2 + 8) = local_e0._8_8_;
        }
        else {
          (local_88->m_message)._M_dataplus._M_p = local_f0._M_p;
          (local_88->m_message).field_2._M_allocated_capacity =
               CONCAT71(local_e0._M_allocated_capacity._1_7_,local_e0._M_local_buf[0]);
        }
        (local_88->m_message)._M_string_length = local_e8;
        local_e8 = 0;
        local_e0._M_local_buf[0] = '\0';
        __return_storage_ptr__ = local_88;
        local_f0._M_p = (pointer)&local_e0;
      }
      else {
        std::operator+(&local_80,
                       "For this neural network classifier, the probabilities are obtained from the layer \'"
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_b0);
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_80);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        psVar11 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_d0.field_2._M_allocated_capacity = *psVar11;
          local_d0.field_2._8_8_ = plVar10[3];
        }
        else {
          local_d0.field_2._M_allocated_capacity = *psVar11;
          local_d0._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_d0._M_string_length = plVar10[1];
        *plVar10 = (long)psVar11;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_d0);
LAB_004f30a0:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
      }
      if (local_b0 != (undefined1  [8])local_a0) {
        operator_delete((void *)local_b0,local_a0._0_8_ + 1);
      }
    }
    else {
      *(pointer *)__return_storage_ptr__ = local_f8;
      paVar1 = &(__return_storage_ptr__->m_message).field_2;
      (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_p == &local_e0) {
        paVar1->_M_allocated_capacity =
             CONCAT71(local_e0._M_allocated_capacity._1_7_,local_e0._M_local_buf[0]);
        *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_e0._8_8_;
      }
      else {
        (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_f0._M_p;
        (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
             CONCAT71(local_e0._M_allocated_capacity._1_7_,local_e0._M_local_buf[0]);
      }
      (__return_storage_ptr__->m_message)._M_string_length = local_e8;
      local_e8 = 0;
      local_e0._M_local_buf[0] = '\0';
      local_f0._M_p = (pointer)&local_e0;
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_60);
  }
  else {
    *(pointer *)__return_storage_ptr__ = local_f8;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_p == &local_e0) {
      paVar1->_M_allocated_capacity =
           CONCAT71(local_e0._M_allocated_capacity._1_7_,local_e0._M_local_buf[0]);
      *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_e0._8_8_;
    }
    else {
      (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_f0._M_p;
      (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
           CONCAT71(local_e0._M_allocated_capacity._1_7_,local_e0._M_local_buf[0]);
    }
    (__return_storage_ptr__->m_message)._M_string_length = local_e8;
    local_e8 = 0;
    local_e0._M_local_buf[0] = '\0';
    local_f0._M_p = (pointer)&local_e0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_p != &local_e0) {
    operator_delete(local_f0._M_p,
                    CONCAT71(local_e0._M_allocated_capacity._1_7_,local_e0._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_neuralNetworkClassifier>(const Specification::Model& format) {
        // must have classifier parameters
        Result r = validateClassifierInterface(format, format.neuralnetworkclassifier());
        if (!r.good()) {
            return r;
        }
        
        std::set<std::string> outputBlobNames;
        r = validateNeuralNetworkTopLevel(format.description(), format.neuralnetworkclassifier(), outputBlobNames, format.isupdatable());
        
        if (!r.good()) {
            return r;
        }
        
        std::string probBlob = format.neuralnetworkclassifier().labelprobabilitylayername();
        // Check if the probability blob name was provided in the proto
        if (probBlob.compare("") != 0) {
            // Check if it corresponds to some output of the network
            if (outputBlobNames.find(probBlob) == outputBlobNames.end()) {
                std::string err = "For this neural network classifier, the probabilities are obtained from the layer '" + probBlob + "' which was not found in the network.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            }
        }
        
        // Now, we need to check that all the model's output names are either blob names or the extra outputs
        // for a classifier
        for (const auto& output : format.description().output()) {
            // is it not an output blob?
            if (outputBlobNames.find(output.name()) == outputBlobNames.end()) {
                if (output.name().compare(format.description().predictedfeaturename()) != 0
                    && output.name().compare(format.description().predictedprobabilitiesname()) != 0) {
                    std::string err = "Output layer '" + output.name() + "' is not produced by any layer of the neural network.";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
            }
        }
        
        return r;
        
    }